

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void TPZEqnArray<std::complex<double>_>::main(void)

{
  long col;
  int iVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  long lVar5;
  long lVar6;
  complex<double> val;
  TPZFMatrix<std::complex<double>_> MatrixA;
  char filename [20];
  TPZFMatrix<std::complex<double>_> rhs;
  TPZFMatrix<std::complex<double>_> rhs2;
  ofstream output;
  TPZEqnArray<std::complex<double>_> Test;
  
  std::operator<<((ostream *)&std::cout,"Entre o nome do Arquivo\n");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,filename);
  std::ofstream::ofstream(&output,filename,_S_app);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&MatrixA,10,10);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; col = lVar5 + lVar6, col != 10; lVar6 = lVar6 + 1) {
      iVar1 = rand();
      pcVar2 = TPZFMatrix<std::complex<double>_>::operator()(&MatrixA,lVar5,col);
      *(double *)pcVar2->_M_value = ((double)iVar1 * 10.0) / 2147483647.0;
      *(undefined8 *)(pcVar2->_M_value + 8) = 0;
      pcVar2 = TPZFMatrix<std::complex<double>_>::operator()(&MatrixA,lVar5,col);
      pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(&MatrixA,col,lVar5);
      uVar4 = *(undefined8 *)(pcVar2->_M_value + 8);
      *(undefined8 *)pcVar3->_M_value = *(undefined8 *)pcVar2->_M_value;
      *(undefined8 *)(pcVar3->_M_value + 8) = uVar4;
      if (lVar6 == 0) {
        pcVar2 = TPZFMatrix<std::complex<double>_>::operator()(&MatrixA,lVar5,lVar5);
        *(undefined8 *)pcVar2->_M_value = 0x40b7700000000000;
        *(undefined8 *)(pcVar2->_M_value + 8) = 0;
      }
    }
  }
  TPZMatrix<std::complex<double>_>::Print
            (&MatrixA.super_TPZMatrix<std::complex<double>_>,"Teste 1",(ostream *)&std::cout,
             EFormatted);
  TPZFMatrix<std::complex<double>_>::Decompose_Cholesky(&MatrixA);
  uVar4 = 0;
  TPZMatrix<std::complex<double>_>::Print
            (&MatrixA.super_TPZMatrix<std::complex<double>_>,"Decomposta",(ostream *)&std::cout,
             EFormatted);
  TPZEqnArray(&Test);
  Reset(&Test);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    BeginEquation(&Test,(int)lVar5);
    for (lVar6 = lVar5; lVar6 != 10; lVar6 = lVar6 + 1) {
      TPZFMatrix<std::complex<double>_>::operator()(&MatrixA,lVar5,lVar6);
      val._M_value._8_8_ = uVar4;
      val._M_value._0_8_ = extraout_RDX;
      AddTerm(&Test,(int)lVar6,val);
    }
    EndEquation(&Test);
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&rhs,10,1);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&rhs2,10,1);
  memset(rhs.fElem,0,
         rhs.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         rhs.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  rhs.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  pcVar2 = TPZFMatrix<std::complex<double>_>::operator()(&rhs,0,0);
  *(undefined8 *)pcVar2->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar2->_M_value + 8) = 0;
  TPZFMatrix<std::complex<double>_>::operator=(&rhs2,&rhs);
  Print(&Test,"Result",(ostream *)&std::cout);
  TPZFMatrix<std::complex<double>_>::Subst_Forward(&MatrixA,&rhs);
  EqnForward(&Test,&rhs2,ECholesky);
  TPZMatrix<std::complex<double>_>::Print
            (&rhs.super_TPZMatrix<std::complex<double>_>,"FMatrix Decomposition",
             (ostream *)&std::cout,EFormatted);
  TPZMatrix<std::complex<double>_>::Print
            (&rhs2.super_TPZMatrix<std::complex<double>_>,"FrontalMatrix Decomposition",
             (ostream *)&std::cout,EFormatted);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&rhs2);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&rhs);
  ~TPZEqnArray(&Test);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&MatrixA);
  std::ofstream::~ofstream(&output);
  return;
}

Assistant:

void TPZEqnArray<TVar>::main()
{
	char  filename[20];
	
	cout << "Entre o nome do Arquivo\n";
	cin >> filename;
	ofstream output(filename,ios::app);
	
	TPZFMatrix<TVar> MatrixA(10,10);
	int i, j; 
	for(i=0;i<10;i++) {
		for(j=i;j<10;j++) {
			int random = rand();
			double rnd = (random*10.)/RAND_MAX;
			MatrixA(i,j)=rnd;
			MatrixA(j,i)=MatrixA(i,j);
			if(i==j) MatrixA(i,j)=6000.;
		}
	}

	MatrixA.Print("Teste 1",std::cout);
	MatrixA.Decompose_Cholesky();
	MatrixA.Print("Decomposta",std::cout);
	
	TPZEqnArray<TVar> Test;
	Test.Reset();
	for(i=0;i<10;i++) {
		Test.BeginEquation(i);
		for(j=i;j<10;j++) {
			Test.AddTerm(j, MatrixA(i,j));
		}
		Test.EndEquation(); 
	}
	
	TPZFMatrix<TVar> rhs(10,1), rhs2(10,1);
	//Inicializar rhs:
	rhs.Zero();
	rhs(0,0) = 1.;
	rhs2=rhs;
	
	Test.Print("Result", cout);
	
	MatrixA.Subst_Forward(&rhs);
	DecomposeType decType = ECholesky;
	Test.EqnForward(rhs2, decType);
	
	rhs.Print("FMatrix Decomposition"); 
	rhs2.Print("FrontalMatrix Decomposition"); 
	
}